

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cc
# Opt level: O3

string * __thiscall
benchmark::StringPrintFImp_abi_cxx11_
          (string *__return_storage_ptr__,benchmark *this,char *msg,__va_list_tag *args)

{
  uint uVar1;
  size_t sVar2;
  char *__s;
  va_list args_cp;
  array<char,_256UL> local_buff;
  allocator local_149;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  char local_128 [256];
  
  local_138 = *(undefined8 *)(msg + 0x10);
  local_148 = *(undefined8 *)msg;
  uStack_140 = *(undefined8 *)(msg + 8);
  uVar1 = vsnprintf(local_128,0x100,(char *)this,&local_148);
  if (uVar1 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else if (uVar1 < 0x100) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar2 = strlen(local_128);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,local_128,local_128 + sVar2);
  }
  else {
    __s = (char *)operator_new__((long)(int)uVar1 + 1U);
    vsnprintf(__s,(long)(int)uVar1 + 1U,(char *)this,msg);
    std::__cxx11::string::string((string *)__return_storage_ptr__,__s,&local_149);
    operator_delete__(__s);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringPrintFImp(const char *msg, va_list args)
{
  // we might need a second shot at this, so pre-emptivly make a copy
  va_list args_cp;
  va_copy(args_cp, args);

  // TODO(ericwf): use std::array for first attempt to avoid one memory
  // allocation guess what the size might be
  std::array<char, 256> local_buff;
  std::size_t size = local_buff.size();
  // 2015-10-08: vsnprintf is used instead of snd::vsnprintf due to a limitation in the android-ndk
  auto ret = vsnprintf(local_buff.data(), size, msg, args_cp);

  va_end(args_cp);

  // handle empty expansion
  if (ret == 0)
    return std::string{};
  if (static_cast<std::size_t>(ret) < size)
    return std::string(local_buff.data());

  // we did not provide a long enough buffer on our first attempt.
  // add 1 to size to account for null-byte in size cast to prevent overflow
  size = static_cast<std::size_t>(ret) + 1;
  auto buff_ptr = std::unique_ptr<char[]>(new char[size]);
  // 2015-10-08: vsnprintf is used instead of snd::vsnprintf due to a limitation in the android-ndk
  ret = vsnprintf(buff_ptr.get(), size, msg, args);
  return std::string(buff_ptr.get());
}